

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O2

int32_t __thiscall
icu_63::number::impl::ConstantMultiFieldModifier::apply
          (ConstantMultiFieldModifier *this,NumberStringBuilder *output,int leftIndex,int rightIndex
          ,UErrorCode *status)

{
  int32_t iVar1;
  int32_t iVar2;
  ssize_t sVar3;
  UnicodeString local_70;
  
  iVar1 = NumberStringBuilder::insert(output,leftIndex,&this->fPrefix,status);
  if (this->fOverwrite == true) {
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003daac8;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    sVar3 = NumberStringBuilder::splice
                      (output,leftIndex + iVar1,(__off64_t *)(ulong)(uint)(rightIndex + iVar1),
                       (int)&local_70,(__off64_t *)0x0,0,0xb);
    iVar1 = (int)sVar3 + iVar1;
    UnicodeString::~UnicodeString(&local_70);
  }
  iVar2 = NumberStringBuilder::insert(output,rightIndex + iVar1,&this->fSuffix,status);
  return iVar2 + iVar1;
}

Assistant:

int32_t ConstantMultiFieldModifier::apply(NumberStringBuilder &output, int leftIndex, int rightIndex,
                                          UErrorCode &status) const {
    int32_t length = output.insert(leftIndex, fPrefix, status);
    if (fOverwrite) {
        length += output.splice(
            leftIndex + length,
            rightIndex + length,
            UnicodeString(), 0, 0,
            UNUM_FIELD_COUNT, status);
    }
    length += output.insert(rightIndex + length, fSuffix, status);
    return length;
}